

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressTestUtil.cpp
# Opt level: O2

ProgramContext * __thiscall
deqp::gls::LongStressTestUtil::ProgramLibrary::generateTextureContext
          (ProgramContext *__return_storage_ptr__,ProgramLibrary *this,int numTextures,int texWid,
          int texHei,float positionFactor)

{
  bool bVar1;
  allocator<char> local_19a;
  allocator<char> local_199;
  int local_198;
  int local_194;
  ProgramContext *local_190;
  string local_188;
  float local_168;
  Matrix<float,_4,_4> local_158;
  Matrix<float,_4,_4> local_118;
  VarSpec local_d8;
  
  local_198 = texWid;
  local_194 = texHei;
  local_168 = positionFactor;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,
             "${VTX_HEADER}${VTX_IN} highp vec3 a_position;\n${VTX_IN} mediump vec2 a_texCoord;\n${VTX_OUT} mediump vec2 v_texCoord;\nuniform mediump mat4 u_posTrans;\n\nvoid main (void)\n{\n\tgl_Position = u_posTrans * vec4(a_position, 1.0);\n\tv_texCoord = a_texCoord;\n}\n"
             ,&local_19a);
  substitute(&local_d8.name,this,(string *)&local_158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,
             "${FRAG_HEADER}${FRAG_IN} mediump vec2 v_texCoord;\nuniform mediump sampler2D u_sampler;\n\nvoid main (void)\n{\n\t${FRAG_COLOR} = ${TEXTURE_2D_FUNC}(u_sampler, v_texCoord);\n}\n"
             ,&local_199);
  substitute((string *)&local_118,this,&local_188);
  ProgramContext::ProgramContext
            (__return_storage_ptr__,local_d8.name._M_dataplus._M_p,
             (char *)local_118.m_data.m_data[0].m_data._0_8_,"a_position");
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_158);
  local_190 = __return_storage_ptr__;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"a_position",&local_19a);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&local_118,-local_168);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&local_188,local_168);
  VarSpec::VarSpec<tcu::Vector<float,3>>
            (&local_d8,(string *)&local_158,(Vector<float,_3> *)&local_118,
             (Vector<float,_3> *)&local_188);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(&__return_storage_ptr__->attributes,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"a_texCoord",&local_19a);
  local_118.m_data.m_data[0].m_data._0_8_ = (pointer)0x0;
  local_188._M_dataplus._M_p = (pointer)0x3f8000003f800000;
  VarSpec::VarSpec<tcu::Vector<float,2>>
            (&local_d8,(string *)&local_158,(Vector<float,_2> *)&local_118,
             (Vector<float,_2> *)&local_188);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(&__return_storage_ptr__->attributes,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"u_sampler",(allocator<char> *)&local_188);
  local_118.m_data.m_data[0].m_data._0_8_ =
       local_118.m_data.m_data[0].m_data._0_8_ & 0xffffffff00000000;
  VarSpec::VarSpec<int>(&local_d8,(string *)&local_158,(int *)&local_118);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(&__return_storage_ptr__->uniforms,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"u_posTrans",&local_19a);
  translationMat<4>(&local_158,local_168 + -1.0);
  translationMat<4>(&local_118,1.0 - local_168);
  VarSpec::VarSpec<tcu::Matrix<float,4,4>>(&local_d8,&local_188,&local_158,&local_118);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(&__return_storage_ptr__->uniforms,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_188);
  if (numTextures < 1) {
    numTextures = 0;
  }
  while (bVar1 = numTextures != 0, numTextures = numTextures + -1, bVar1) {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_158,0.0);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_118,1.0);
    TextureSpec::TextureSpec
              ((TextureSpec *)&local_d8,TEXTURETYPE_2D,0,local_198,local_194,0x1908,0x1401,0x1908,
               true,0x2703,0x2601,0x2901,0x2901,(Vec4 *)&local_158,(Vec4 *)&local_118);
    std::vector<deqp::gls::TextureSpec,_std::allocator<deqp::gls::TextureSpec>_>::
    emplace_back<deqp::gls::TextureSpec>
              (&__return_storage_ptr__->textureSpecs,(TextureSpec *)&local_d8);
  }
  return local_190;
}

Assistant:

gls::ProgramContext ProgramLibrary::generateTextureContext (const int numTextures, const int texWid, const int texHei, const float positionFactor) const
{
	static const char* const vertexTemplate =
		"${VTX_HEADER}"
		"${VTX_IN} highp vec3 a_position;\n"
		"${VTX_IN} mediump vec2 a_texCoord;\n"
		"${VTX_OUT} mediump vec2 v_texCoord;\n"
		"uniform mediump mat4 u_posTrans;\n"
		"\n"
		"void main (void)\n"
		"{\n"
		"	gl_Position = u_posTrans * vec4(a_position, 1.0);\n"
		"	v_texCoord = a_texCoord;\n"
		"}\n";

	static const char* const fragmentTemplate =
		"${FRAG_HEADER}"
		"${FRAG_IN} mediump vec2 v_texCoord;\n"
		"uniform mediump sampler2D u_sampler;\n"
		"\n"
		"void main (void)\n"
		"{\n"
		"	${FRAG_COLOR} = ${TEXTURE_2D_FUNC}(u_sampler, v_texCoord);\n"
		"}\n";

	gls::ProgramContext context(substitute(vertexTemplate).c_str(), substitute(fragmentTemplate).c_str(), "a_position");

	context.attributes.push_back(gls::VarSpec("a_position",		Vec3(-positionFactor),						Vec3(positionFactor)));
	context.attributes.push_back(gls::VarSpec("a_texCoord",		Vec2(0.0f),									Vec2(1.0f)));

	context.uniforms.push_back(gls::VarSpec("u_sampler",		0));
	context.uniforms.push_back(gls::VarSpec("u_posTrans",		translationMat<4>(positionFactor-1.0f),		translationMat<4>(1.0f-positionFactor)));

	for (int i = 0; i < numTextures; i++)
		context.textureSpecs.push_back(gls::TextureSpec(glu::TextureTestUtil::TEXTURETYPE_2D, 0,
														texWid, texHei, GL_RGBA, GL_UNSIGNED_BYTE, GL_RGBA, true,
														GL_LINEAR_MIPMAP_LINEAR, GL_LINEAR, GL_REPEAT, GL_REPEAT,
														Vec4(0.0f), Vec4(1.0f)));

	return context;
}